

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::GetSynchControllersForObjects
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,IPalObject **rgObjects,
          DWORD dwObjectCount,void **ppvControllers,ControllerType ctCtrlrType)

{
  int iVar1;
  PalObjectTypeId PVar2;
  undefined4 extraout_var;
  CSynchData *local_298;
  undefined8 *local_288;
  IDataLock *pDataLock;
  CProcProcessLocalData *pProcLocData;
  CSynchData *pCStack_270;
  ObjectDomain odObjectDomain;
  CSynchData *psdSynchData;
  void *pvSData;
  anon_union_512_2_150356a7 Ctrlrs;
  WaitDomain local_58;
  uint uStack_54;
  bool fLocalSynchLock;
  uint uErrCleanupIdxLastCtrlr;
  uint uErrCleanupIdxFirstNotInitializedCtrlr;
  CObjectType *potObjectType;
  WaitDomain wdWaitDomain;
  uint uSharedObjectCount;
  uint uCount;
  uint uIdx;
  PAL_ERROR palErr;
  ControllerType ctCtrlrType_local;
  void **ppvControllers_local;
  IPalObject **ppIStack_20;
  DWORD dwObjectCount_local;
  IPalObject **rgObjects_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  uCount = 0;
  wdWaitDomain = LocalWait;
  potObjectType._4_4_ = LocalWait;
  potObjectType._0_4_ = LocalWait;
  _uErrCleanupIdxLastCtrlr = (CObjectType *)0x0;
  uStack_54 = 0;
  local_58 = LocalWait;
  Ctrlrs._511_1_ = 0;
  uIdx = ctCtrlrType;
  _palErr = ppvControllers;
  ppvControllers_local._4_4_ = dwObjectCount;
  ppIStack_20 = rgObjects;
  rgObjects_local = (IPalObject **)pthrCurrent;
  pthrCurrent_local = (CPalThread *)this;
  if ((dwObjectCount == 0) || (0x40 < dwObjectCount)) {
    uCount = 0x57;
  }
  else {
    if (ctCtrlrType == WaitController) {
      wdWaitDomain = CSynchCache<CorUnix::CSynchWaitController>::Get
                               (&this->m_cacheWaitCtrlrs,pthrCurrent,dwObjectCount,
                                (CSynchWaitController **)&pvSData);
    }
    else {
      wdWaitDomain = CSynchCache<CorUnix::CSynchStateController>::Get
                               (&this->m_cacheStateCtrlrs,pthrCurrent,dwObjectCount,
                                (CSynchStateController **)&pvSData);
    }
    if (wdWaitDomain < ppvControllers_local._4_4_) {
      local_58 = wdWaitDomain;
      uCount = 8;
    }
    else {
      AcquireLocalSynchLock((CPalThread *)rgObjects_local);
      Ctrlrs._511_1_ = 1;
      for (uSharedObjectCount = 0; uSharedObjectCount < ppvControllers_local._4_4_;
          uSharedObjectCount = uSharedObjectCount + 1) {
        iVar1 = (*ppIStack_20[uSharedObjectCount]->_vptr_IPalObject[9])();
        if (iVar1 == 1) {
          potObjectType._4_4_ = potObjectType._4_4_ + MixedWait;
        }
        if ((potObjectType._4_4_ != LocalWait) && (potObjectType._4_4_ <= uSharedObjectCount)) {
          potObjectType._0_4_ = MixedWait;
          break;
        }
      }
      if (ppvControllers_local._4_4_ == potObjectType._4_4_) {
        potObjectType._0_4_ = SharedWait;
      }
      for (uSharedObjectCount = 0; uSharedObjectCount < ppvControllers_local._4_4_;
          uSharedObjectCount = uSharedObjectCount + 1) {
        pProcLocData._4_4_ = (*ppIStack_20[uSharedObjectCount]->_vptr_IPalObject[9])();
        uCount = (*ppIStack_20[uSharedObjectCount]->_vptr_IPalObject[10])
                           (ppIStack_20[uSharedObjectCount],&psdSynchData);
        if (uCount != 0) break;
        if (pProcLocData._4_4_ == SharedObject) {
          local_298 = (CSynchData *)SHMPtrToPtr((SHMPTR)psdSynchData);
        }
        else {
          local_298 = psdSynchData;
        }
        pCStack_270 = local_298;
        iVar1 = (**ppIStack_20[uSharedObjectCount]->_vptr_IPalObject)();
        _uErrCleanupIdxLastCtrlr = (CObjectType *)CONCAT44(extraout_var,iVar1);
        if (uIdx == 0) {
          CSynchControllerBase::Init
                    ((CSynchControllerBase *)((long)(&pvSData)[uSharedObjectCount] + 8),
                     (CPalThread *)rgObjects_local,WaitController,pProcLocData._4_4_,
                     _uErrCleanupIdxLastCtrlr,pCStack_270,(WaitDomain)potObjectType);
        }
        else {
          CSynchControllerBase::Init
                    ((CSynchControllerBase *)((long)(&pvSData)[uSharedObjectCount] + 8),
                     (CPalThread *)rgObjects_local,uIdx,pProcLocData._4_4_,_uErrCleanupIdxLastCtrlr,
                     pCStack_270,(WaitDomain)potObjectType);
        }
        if ((uIdx == 0) &&
           (PVar2 = CObjectType::GetId(_uErrCleanupIdxLastCtrlr), PVar2 == otiProcess)) {
          uCount = (*ppIStack_20[uSharedObjectCount]->_vptr_IPalObject[3])
                             (ppIStack_20[uSharedObjectCount],rgObjects_local,0,&local_288,
                              &pDataLock);
          if (uCount != 0) {
            uSharedObjectCount = uSharedObjectCount + 1;
            break;
          }
          CSynchWaitController::SetProcessLocalData
                    ((CSynchWaitController *)(&pvSData)[uSharedObjectCount],
                     (CProcProcessLocalData *)pDataLock);
          (**(code **)*local_288)(local_288,rgObjects_local,0);
        }
      }
      if (uCount == 0) {
        if (uIdx == 0) {
          for (uSharedObjectCount = 0; uSharedObjectCount < ppvControllers_local._4_4_;
              uSharedObjectCount = uSharedObjectCount + 1) {
            _palErr[uSharedObjectCount] = (&pvSData)[uSharedObjectCount];
          }
        }
        else {
          for (uSharedObjectCount = 0; uSharedObjectCount < ppvControllers_local._4_4_;
              uSharedObjectCount = uSharedObjectCount + 1) {
            _palErr[uSharedObjectCount] = (&pvSData)[uSharedObjectCount];
          }
        }
        goto LAB_0015fa55;
      }
      uStack_54 = uSharedObjectCount;
      local_58 = ppvControllers_local._4_4_;
    }
    if (uIdx == 0) {
      for (uSharedObjectCount = 0; uSharedObjectCount < uStack_54;
          uSharedObjectCount = uSharedObjectCount + 1) {
        CSynchControllerBase::Release
                  ((CSynchControllerBase *)((long)(&pvSData)[uSharedObjectCount] + 8));
      }
      for (uSharedObjectCount = uStack_54; uSharedObjectCount < local_58;
          uSharedObjectCount = uSharedObjectCount + 1) {
        CSynchCache<CorUnix::CSynchWaitController>::Add
                  (&this->m_cacheWaitCtrlrs,(CPalThread *)rgObjects_local,
                   (CSynchWaitController *)(&pvSData)[uSharedObjectCount]);
      }
    }
    else {
      for (uSharedObjectCount = 0; uSharedObjectCount < uStack_54;
          uSharedObjectCount = uSharedObjectCount + 1) {
        CSynchControllerBase::Release
                  ((CSynchControllerBase *)((long)(&pvSData)[uSharedObjectCount] + 8));
      }
      for (uSharedObjectCount = uStack_54; uSharedObjectCount < local_58;
          uSharedObjectCount = uSharedObjectCount + 1) {
        CSynchCache<CorUnix::CSynchStateController>::Add
                  (&this->m_cacheStateCtrlrs,(CPalThread *)rgObjects_local,
                   (CSynchStateController *)(&pvSData)[uSharedObjectCount]);
      }
    }
  }
LAB_0015fa55:
  if ((Ctrlrs._511_1_ & 1) != 0) {
    ReleaseLocalSynchLock((CPalThread *)rgObjects_local);
  }
  return uCount;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::GetSynchControllersForObjects(
        CPalThread *pthrCurrent,
        IPalObject *rgObjects[],
        DWORD dwObjectCount,
        void ** ppvControllers,
        CSynchControllerBase::ControllerType ctCtrlrType)
    {
        PAL_ERROR palErr = NO_ERROR;
        unsigned int uIdx, uCount = 0, uSharedObjectCount = 0;
        WaitDomain wdWaitDomain = LocalWait;
        CObjectType * potObjectType = NULL;
        unsigned int uErrCleanupIdxFirstNotInitializedCtrlr = 0;
        unsigned int uErrCleanupIdxLastCtrlr = 0;
        bool fLocalSynchLock = false;
        union
        {
            CSynchWaitController * pWaitCtrlrs[MAXIMUM_WAIT_OBJECTS];
            CSynchStateController * pStateCtrlrs[MAXIMUM_WAIT_OBJECTS];
        } Ctrlrs;

        if ((dwObjectCount <= 0) || (dwObjectCount > MAXIMUM_WAIT_OBJECTS))
        {
            palErr = ERROR_INVALID_PARAMETER;
            goto GSCFO_exit;
        }

        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            uCount = (unsigned int)m_cacheWaitCtrlrs.Get(pthrCurrent,
                                                         dwObjectCount,
                                                         Ctrlrs.pWaitCtrlrs);
        }
        else
        {
            uCount = (unsigned int)m_cacheStateCtrlrs.Get(pthrCurrent,
                                                          dwObjectCount,
                                                          Ctrlrs.pStateCtrlrs);
        }
        if (uCount < dwObjectCount)
        {
            // We got less controllers (uCount) than we asked for (dwObjectCount),
            // probably because of low memory.
            // None of these controllers is initialized, so they must be all
            // returned directly to the cache
            uErrCleanupIdxLastCtrlr = uCount;

            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto GSCFO_error_cleanup;
        }

        //
        // We need to acquire the local synch lock before evaluating object
        // domains
        //
        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        for (uIdx=0; uIdx<dwObjectCount; uIdx++)
        {
            if (SharedObject == rgObjects[uIdx]->GetObjectDomain())
            {
                ++uSharedObjectCount;
            }
            if (uSharedObjectCount > 0 && uSharedObjectCount <= uIdx)
            {
                wdWaitDomain = MixedWait;
                break;
            }
        }
        if (dwObjectCount == uSharedObjectCount)
        {
            wdWaitDomain = SharedWait;
        }

        for (uIdx=0;uIdx<dwObjectCount;uIdx++)
        {
            void * pvSData;
            CSynchData * psdSynchData;
            ObjectDomain odObjectDomain = rgObjects[uIdx]->GetObjectDomain();

            palErr = rgObjects[uIdx]->GetObjectSynchData((void **)&pvSData);
            if (NO_ERROR != palErr)
            {
                break;
            }

            psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
                CSynchData, reinterpret_cast<SharedID>(pvSData)) :
                static_cast<CSynchData *>(pvSData);

            VALIDATEOBJECT(psdSynchData);

            potObjectType = rgObjects[uIdx]->GetObjectType();


            if (CSynchControllerBase::WaitController == ctCtrlrType)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Init(pthrCurrent,
                                            ctCtrlrType,
                                            odObjectDomain,
                                            potObjectType,
                                            psdSynchData,
                                            wdWaitDomain);
            }
            else
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Init(pthrCurrent,
                                             ctCtrlrType,
                                             odObjectDomain,
                                             potObjectType,
                                             psdSynchData,
                                             wdWaitDomain);
            }

            if (CSynchControllerBase::WaitController == ctCtrlrType &&
                otiProcess == potObjectType->GetId())
            {
                CProcProcessLocalData * pProcLocData;
                IDataLock * pDataLock;

                palErr = rgObjects[uIdx]->GetProcessLocalData(
                    pthrCurrent,
                    ReadLock,
                    &pDataLock,
                    (void **)&pProcLocData);
                if (NO_ERROR != palErr)
                {
                    // In case of failure here, bail out of the loop, but
                    // keep track (by incrementing the counter 'uIdx') of the
                    // fact that this controller has already being initialized
                    // and therefore need to be Release'd rather than just
                    // returned to the cache
                    uIdx++;
                    break;
                }

                Ctrlrs.pWaitCtrlrs[uIdx]->SetProcessLocalData(pProcLocData);
                pDataLock->ReleaseLock(pthrCurrent, false);
            }
        }
        if (NO_ERROR != palErr)
        {
            // An error occurred while initializing the (uIdx+1)-th controller,
            // i.e. the one at index uIdx; therefore the first uIdx controllers
            // must be Release'd, while the remaining uCount-uIdx must be returned
            // directly to the cache.
            uErrCleanupIdxFirstNotInitializedCtrlr = uIdx;
            uErrCleanupIdxLastCtrlr = dwObjectCount;

            goto GSCFO_error_cleanup;
        }

        // Succeeded
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // The multiple cast is NEEDED, though currently it does not
                // change the value ot the pointer. Anyway, if in the future
                // a virtual method should be added to the base class
                // CSynchControllerBase, both derived classes would have two
                // virtual tables, therefore a static cast from, for instance,
                // a CSynchWaitController* to a ISynchWaitController* would
                // return the given pointer incremented by the size of a
                // generic pointer on the specific platform

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchWaitController *>(Ctrlrs.pWaitCtrlrs[uIdx]));
            }
        }
        else
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // See comment above

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchStateController *>(Ctrlrs.pStateCtrlrs[uIdx]));
            }
        }

        // Succeeded: skip error cleanup
        goto GSCFO_exit;

    GSCFO_error_cleanup:
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            // Release already initialized wait controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized wait controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheWaitCtrlrs.Add(pthrCurrent, Ctrlrs.pWaitCtrlrs[uIdx]);
            }
        }
        else
        {
            // Release already initialized state controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized state controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheStateCtrlrs.Add(pthrCurrent, Ctrlrs.pStateCtrlrs[uIdx]);
            }
        }

    GSCFO_exit:

        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        return palErr;
    }